

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O1

void __thiscall
soul::ResolutionPass::FunctionResolver::PossibleFunction::PossibleFunction
          (PossibleFunction *this,Function *f,ArrayView<soul::Type> argTypes,
          ArrayView<soul::pool_ptr<soul::AST::Constant>_> constantArgValues)

{
  Constant *pCVar1;
  StructurePtr o;
  bool bVar2;
  long lVar3;
  Type *source;
  ulong uVar4;
  Type targetParamType;
  Type local_68;
  ulong local_50;
  Type local_48;
  
  source = argTypes.s;
  this->function = f;
  this->isImpossible = false;
  this->requiresCast = false;
  this->requiresGeneric = false;
  this->functionIsNotResolved = false;
  lVar3 = (long)argTypes.e - (long)source;
  if (lVar3 != 0) {
    lVar3 = (lVar3 >> 3) * -0x5555555555555555;
    local_50 = (long)constantArgValues.e - (long)constantArgValues.s >> 3;
    uVar4 = 0;
    do {
      local_68.category = invalid;
      local_68.arrayElementCategory = invalid;
      local_68.isRef = false;
      local_68.isConstant = false;
      local_68.primitiveType.type = invalid;
      local_68.boundingSize = 0;
      local_68.arrayElementBoundingSize = 0;
      local_68.structure.object = (Structure *)0x0;
      bVar2 = AST::VariableDeclaration::isResolved
                        ((this->function->parameters).
                         super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar4].object);
      if (bVar2) {
        AST::VariableDeclaration::getType
                  (&local_48,
                   (this->function->parameters).
                   super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar4].object);
        o.object = local_68.structure.object;
        local_68.category = local_48.category;
        local_68.arrayElementCategory = local_48.arrayElementCategory;
        local_68.isRef = local_48.isRef;
        local_68.isConstant = local_48.isConstant;
        local_68.primitiveType.type = local_48.primitiveType.type;
        local_68.boundingSize = local_48.boundingSize;
        local_68.arrayElementBoundingSize = local_48.arrayElementBoundingSize;
        if (local_48.structure.object != local_68.structure.object) {
          local_68.structure.object = local_48.structure.object;
          local_48.structure.object = (Structure *)0x0;
          RefCountedPtr<soul::Structure>::decIfNotNull(o.object);
        }
        RefCountedPtr<soul::Structure>::decIfNotNull(local_48.structure.object);
        bVar2 = TypeRules::canPassAsArgumentTo(&local_68,source,true);
        if (!bVar2) {
          bVar2 = TypeRules::canPassAsArgumentTo(&local_68,source,false);
          if (!bVar2) {
            if (local_50 <= uVar4) {
              throwInternalCompilerError("i < size()","operator[]",0xc4);
            }
            pCVar1 = constantArgValues.s[uVar4].object;
            if (pCVar1 != (Constant *)0x0) {
              bVar2 = TypeRules::canSilentlyCastTo(&local_68,&pCVar1->value);
              if (bVar2) goto LAB_0021d926;
            }
            this->isImpossible = true;
          }
LAB_0021d926:
          this->requiresCast = true;
        }
      }
      else if ((this->function->genericWildcards).
               super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               (this->function->genericWildcards).
               super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
        this->functionIsNotResolved = true;
      }
      else {
        this->requiresGeneric = true;
      }
      RefCountedPtr<soul::Structure>::decIfNotNull(local_68.structure.object);
      uVar4 = uVar4 + 1;
      source = source + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != uVar4);
  }
  return;
}

Assistant:

PossibleFunction (AST::Function& f, ArrayView<Type> argTypes,
                              ArrayView<pool_ptr<AST::Constant>> constantArgValues)
                : function (f)
            {
                for (size_t i = 0; i < argTypes.size(); ++i)
                {
                    Type targetParamType;

                    if (! function.parameters[i]->isResolved())
                    {
                        if (function.isGeneric())
                            requiresGeneric = true;
                        else
                            functionIsNotResolved = true;

                        continue;
                    }

                    targetParamType = function.parameters[i]->getType();

                    if (TypeRules::canPassAsArgumentTo (targetParamType, argTypes[i], true))
                        continue;

                    if (! TypeRules::canPassAsArgumentTo (targetParamType, argTypes[i], false))
                    {
                        if (constantArgValues[i] == nullptr
                             || ! TypeRules::canSilentlyCastTo (targetParamType, constantArgValues[i]->value))
                            isImpossible = true;
                    }

                    requiresCast = true;
                }
            }